

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

String * __thiscall
Rml::EventDispatcher::ToString_abi_cxx11_(String *__return_storage_ptr__,EventDispatcher *this)

{
  pointer pEVar1;
  EventId id;
  int count;
  const_iterator __end1;
  const_iterator __begin1;
  pointer pEVar2;
  anon_class_8_1_6971b95b add_to_result;
  anon_class_8_1_6971b95b local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar2 = (this->listeners).
           super__Vector_base<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->listeners).
           super__Vector_base<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar2 != pEVar1) {
    id = pEVar2->id;
    count = 0;
    local_28.result = __return_storage_ptr__;
    for (; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
      if (pEVar2->id != id) {
        ToString::anon_class_8_1_6971b95b::operator()(&local_28,id,count);
        id = pEVar2->id;
        count = 0;
      }
      count = count + 1;
    }
    if (0 < count) {
      ToString::anon_class_8_1_6971b95b::operator()(&local_28,id,count);
    }
    if (2 < __return_storage_ptr__->_M_string_length) {
      ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String EventDispatcher::ToString() const
{
	String result;

	if (listeners.empty())
		return result;

	auto add_to_result = [&result](EventId id, int count) {
		const EventSpecification& specification = EventSpecificationInterface::Get(id);
		result += CreateString("%s (%d), ", specification.type.c_str(), count);
	};

	EventId previous_id = listeners[0].id;
	int count = 0;
	for (const auto& listener : listeners)
	{
		if (listener.id != previous_id)
		{
			add_to_result(previous_id, count);
			previous_id = listener.id;
			count = 0;
		}
		count++;
	}

	if (count > 0)
		add_to_result(previous_id, count);

	if (result.size() > 2)
		result.resize(result.size() - 2);

	return result;
}